

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate> * __thiscall
anon_unknown.dwarf_2e8cd18::PeerManagerImpl::Find1P1CPackage
          (optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate>
           *__return_storage_ptr__,PeerManagerImpl *this,CTransactionRef *ptx,NodeId nodeid)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [16];
  bool bVar4;
  CRollingBloomFilter *pCVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  pointer puVar10;
  pointer parent_sender;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Span<const_unsigned_char> vKey;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  Span<const_unsigned_char> vKey_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  Span<const_unsigned_char> vKey_01;
  Package maybe_cpfp_package_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tx_indices;
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  cpfp_candidates_different_peer;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  cpfp_candidates_same_peer;
  allocator_type local_e1;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_e0;
  element_type *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  long local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  local_98;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_80;
  PackageToValidate local_68;
  optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate> *local_38;
  
  local_38 = *(optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate> **)
              (in_FS_OFFSET + 0x28);
  peVar1 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar5 = RecentRejectsReconsiderableFilter(this);
  vKey.m_size = 0x20;
  vKey.m_data = (uchar *)&peVar1->m_witness_hash;
  CRollingBloomFilter::contains(pCVar5,vKey);
  TxOrphanage::GetChildrenFromSamePeer(&local_80,&this->m_orphanage,ptx,nodeid);
  if (local_80.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    parent_sender =
         local_80.
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_68.m_txns.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_68.m_txns.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.m_txns.
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.m_txns.
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.m_txns.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.m_txns.
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.m_txns.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
        }
      }
      local_68.m_txns.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(parent_sender->
                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_68.m_senders.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(parent_sender->
                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                    _M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.m_senders.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.m_senders.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.m_senders.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.m_senders.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.m_senders.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_use_count + 1;
        }
      }
      __l._M_len = 2;
      __l._M_array = (iterator)&local_68;
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)&local_98,__l,(allocator_type *)&local_b0);
      lVar9 = 0x20;
      do {
        p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&local_80.
                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar9);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        lVar9 = lVar9 + -0x10;
      } while (lVar9 != 0);
      pCVar5 = RecentRejectsReconsiderableFilter(this);
      GetPackageHash((uint256 *)&local_68,
                     (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)&local_98);
      vKey_00.m_size = 0x20;
      vKey_00.m_data = (uchar *)&local_68;
      bVar4 = CRollingBloomFilter::contains(pCVar5,vKey_00);
      if (!bVar4) {
        PackageToValidate::PackageToValidate
                  (&local_68,
                   (CTransactionRef *)
                   (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                   (CTransactionRef *)
                   (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(NodeId)parent_sender,nodeid);
        std::optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate>::
        optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate,_true>
                  (__return_storage_ptr__,&local_68);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_68.m_senders.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        {
          operator_delete(local_68.m_senders.super__Vector_base<long,_std::allocator<long>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)local_68.m_senders.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.m_senders.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector(&local_68.m_txns);
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)&local_98);
        goto LAB_008ef1f3;
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)&local_98);
      parent_sender = parent_sender + 1;
    } while (parent_sender !=
             local_80.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  TxOrphanage::GetChildrenFromDifferentPeer(&local_98,&this->m_orphanage,ptx,nodeid);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b0,
             ((long)local_98.
                    super__Vector_base<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_98.
                    super__Vector_base<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)&local_68);
  auVar3 = _DAT_00e4a2c0;
  if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar6 = (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish +
            (-8 - (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    auVar13._8_4_ = (int)uVar6;
    auVar13._0_8_ = uVar6;
    auVar13._12_4_ = (int)(uVar6 >> 0x20);
    auVar11._0_8_ = uVar6 >> 3;
    auVar11._8_8_ = auVar13._8_8_ >> 3;
    uVar8 = 0;
    auVar11 = auVar11 ^ _DAT_00e4a2c0;
    auVar12 = _DAT_00e4a2b0;
    do {
      auVar13 = auVar12 ^ auVar3;
      if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                  auVar11._4_4_ < auVar13._4_4_) & 1)) {
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = uVar8;
      }
      if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
          auVar13._12_4_ <= auVar11._12_4_) {
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8 + 1] = uVar8 + 1;
      }
      uVar8 = uVar8 + 2;
      lVar9 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar9 + 2;
    } while (((uVar6 >> 3) + 2 & 0xfffffffffffffffe) != uVar8);
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,FastRandomContext&>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->m_rng);
  if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar10 = local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar6 = *puVar10;
      uVar8 = ((long)local_98.
                     super__Vector_base<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_98.
                     super__Vector_base<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      if (uVar8 < uVar6 || uVar8 - uVar6 == 0) {
        if (*(optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate> **)
             (in_FS_OFFSET + 0x28) == local_38) {
          uVar7 = std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
          PackageToValidate::~PackageToValidate(&local_68);
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector(&local_e0);
          if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
          }
          if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (ulong *)0x0) {
            operator_delete(local_b0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_b0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
          ::~vector(&local_98);
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector(&local_80);
          if (*(optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate> **)
               (in_FS_OFFSET + 0x28) == local_38) {
            _Unwind_Resume(uVar7);
          }
        }
        goto LAB_008ef38f;
      }
      local_c8 = local_98.
                 super__Vector_base<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6].first.
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_c0 = local_98.
                 super__Vector_base<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6].first.
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_c0->_M_use_count = local_c0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_c0->_M_use_count = local_c0->_M_use_count + 1;
        }
      }
      local_b8 = local_98.
                 super__Vector_base<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6].second;
      local_68.m_txns.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_68.m_txns.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.m_txns.
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.m_txns.
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.m_txns.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.m_txns.
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.m_txns.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
        }
      }
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_c0->_M_use_count = local_c0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_c0->_M_use_count = local_c0->_M_use_count + 1;
        }
      }
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_68;
      local_68.m_txns.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8;
      local_68.m_senders.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_c0;
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::vector(&local_e0,__l_00,&local_e1);
      lVar9 = 0x20;
      do {
        p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&local_80.
                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar9);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        lVar9 = lVar9 + -0x10;
      } while (lVar9 != 0);
      pCVar5 = RecentRejectsReconsiderableFilter(this);
      GetPackageHash((uint256 *)&local_68,&local_e0);
      vKey_01.m_size = 0x20;
      vKey_01.m_data = (uchar *)&local_68;
      bVar4 = CRollingBloomFilter::contains(pCVar5,vKey_01);
      if (!bVar4) {
        PackageToValidate::PackageToValidate
                  (&local_68,
                   (CTransactionRef *)
                   (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                   (CTransactionRef *)
                   (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(NodeId)&local_c8,nodeid);
        std::optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate>::
        optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate,_true>
                  (__return_storage_ptr__,&local_68);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_68.m_senders.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        {
          operator_delete(local_68.m_senders.super__Vector_base<long,_std::allocator<long>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)local_68.m_senders.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.m_senders.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector(&local_68.m_txns);
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector(&local_e0);
        if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
        }
        goto LAB_008ef1d2;
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&local_e0);
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 !=
             local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  (__return_storage_ptr__->
  super__Optional_base<(anonymous_namespace)::PeerManagerImpl::PackageToValidate,_false,_false>).
  _M_payload.
  super__Optional_payload<(anonymous_namespace)::PeerManagerImpl::PackageToValidate,_true,_false,_false>
  .super__Optional_payload_base<(anonymous_namespace)::PeerManagerImpl::PackageToValidate>.
  _M_engaged = false;
LAB_008ef1d2:
  if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::~vector(&local_98);
LAB_008ef1f3:
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_80);
  if (*(optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate> **)(in_FS_OFFSET + 0x28)
      == local_38) {
    return *(optional<(anonymous_namespace)::PeerManagerImpl::PackageToValidate> **)
            (in_FS_OFFSET + 0x28);
  }
LAB_008ef38f:
  __stack_chk_fail();
}

Assistant:

std::optional<PeerManagerImpl::PackageToValidate> PeerManagerImpl::Find1P1CPackage(const CTransactionRef& ptx, NodeId nodeid)
{
    AssertLockNotHeld(m_peer_mutex);
    AssertLockHeld(g_msgproc_mutex);
    AssertLockHeld(m_tx_download_mutex);

    const auto& parent_wtxid{ptx->GetWitnessHash()};

    Assume(RecentRejectsReconsiderableFilter().contains(parent_wtxid.ToUint256()));

    // Prefer children from this peer. This helps prevent censorship attempts in which an attacker
    // sends lots of fake children for the parent, and we (unluckily) keep selecting the fake
    // children instead of the real one provided by the honest peer.
    const auto cpfp_candidates_same_peer{m_orphanage.GetChildrenFromSamePeer(ptx, nodeid)};

    // These children should be sorted from newest to oldest. In the (probably uncommon) case
    // of children that replace each other, this helps us accept the highest feerate (probably the
    // most recent) one efficiently.
    for (const auto& child : cpfp_candidates_same_peer) {
        Package maybe_cpfp_package{ptx, child};
        if (!RecentRejectsReconsiderableFilter().contains(GetPackageHash(maybe_cpfp_package))) {
            return PeerManagerImpl::PackageToValidate{ptx, child, nodeid, nodeid};
        }
    }

    // If no suitable candidate from the same peer is found, also try children that were provided by
    // a different peer. This is useful because sometimes multiple peers announce both transactions
    // to us, and we happen to download them from different peers (we wouldn't have known that these
    // 2 transactions are related). We still want to find 1p1c packages then.
    //
    // If we start tracking all announcers of orphans, we can restrict this logic to parent + child
    // pairs in which both were provided by the same peer, i.e. delete this step.
    const auto cpfp_candidates_different_peer{m_orphanage.GetChildrenFromDifferentPeer(ptx, nodeid)};

    // Find the first 1p1c that hasn't already been rejected. We randomize the order to not
    // create a bias that attackers can use to delay package acceptance.
    //
    // Create a random permutation of the indices.
    std::vector<size_t> tx_indices(cpfp_candidates_different_peer.size());
    std::iota(tx_indices.begin(), tx_indices.end(), 0);
    std::shuffle(tx_indices.begin(), tx_indices.end(), m_rng);

    for (const auto index : tx_indices) {
        // If we already tried a package and failed for any reason, the combined hash was
        // cached in m_lazy_recent_rejects_reconsiderable.
        const auto [child_tx, child_sender] = cpfp_candidates_different_peer.at(index);
        Package maybe_cpfp_package{ptx, child_tx};
        if (!RecentRejectsReconsiderableFilter().contains(GetPackageHash(maybe_cpfp_package))) {
            return PeerManagerImpl::PackageToValidate{ptx, child_tx, nodeid, child_sender};
        }
    }
    return std::nullopt;
}